

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

iterator __thiscall CP::list<int>::erase(list<int> *this,iterator it)

{
  list<int> *this_local;
  iterator it_local;
  iterator tmp;
  
  list_iterator::list_iterator(&it_local,(it.ptr)->next);
  (it.ptr)->prev->next = (it.ptr)->next;
  (it.ptr)->next->prev = (it.ptr)->prev;
  if (it.ptr != (node *)0x0) {
    operator_delete(it.ptr,0x18);
  }
  this->mSize = this->mSize - 1;
  return (iterator)it_local.ptr;
}

Assistant:

iterator erase(iterator it) {
      iterator tmp(it.ptr->next);
      it.ptr->prev->next = it.ptr->next;
      it.ptr->next->prev = it.ptr->prev;
      delete it.ptr;
      mSize--;
      return tmp;
    }